

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void IRBuilderAsmJs::InitializeMemAccessTypeInfo(ViewType viewType,MemAccessTypeInfo *typeInfo)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  Types TVar4;
  undefined4 *puVar5;
  
  if (typeInfo == (MemAccessTypeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x5af,"(typeInfo)","typeInfo");
    if (!bVar2) goto LAB_004f6a64;
    *puVar5 = 0;
  }
  switch(viewType) {
  case TYPE_INT8:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt8;
    VVar3 = ValueType::GetObject(Int8Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT8:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint8;
    VVar3 = ValueType::GetObject(Uint8Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT16:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt16;
    VVar3 = ValueType::GetObject(Int16Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT16:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint16;
    VVar3 = ValueType::GetObject(Uint16Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT32:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt32;
    VVar3 = ValueType::GetObject(Int32Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT32:
    TVar4 = WAsmJs::FromPrimitiveType<int>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint32;
    VVar3 = ValueType::GetObject(Uint32Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_FLOAT32:
    TVar4 = WAsmJs::FromPrimitiveType<float>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyFloat32;
    VVar3 = ValueType::GetObject(Float32Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_FLOAT64:
    TVar4 = WAsmJs::FromPrimitiveType<double>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyFloat64;
    VVar3 = ValueType::GetObject(Float64Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt64;
    VVar3 = ValueType::GetObject(Int64Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT8_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt8;
    VVar3 = ValueType::GetObject(Int8Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT8_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint8;
    VVar3 = ValueType::GetObject(Uint8Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT16_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt16;
    VVar3 = ValueType::GetObject(Int16Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT16_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint16;
    VVar3 = ValueType::GetObject(Uint16Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_INT32_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyInt32;
    VVar3 = ValueType::GetObject(Int32Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  case TYPE_UINT32_TO_INT64:
    TVar4 = WAsmJs::FromPrimitiveType<long>();
    typeInfo->valueRegType = TVar4;
    typeInfo->type = TyUint32;
    VVar3 = ValueType::GetObject(Uint32Array);
    (typeInfo->arrayType).field_0.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x5bc,"((0))","(0)");
    if (!bVar2) {
LAB_004f6a64:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::InitializeMemAccessTypeInfo(Js::ArrayBufferView::ViewType viewType, _Out_ MemAccessTypeInfo * typeInfo)
{
    AssertOrFailFast(typeInfo);

    switch (viewType)
    {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
    case Js::ArrayBufferView::TYPE_##name: \
        typeInfo->valueRegType = WAsmJs::FromPrimitiveType<RegType>(); \
        typeInfo->type = Ty##irSuffix;\
        typeInfo->arrayType = ValueType::GetObject(ObjectType::##irSuffix##Array); \
        Assert(TySize[Ty##irSuffix] == (1<<align)); \
        break;
#include "Language/AsmJsArrayBufferViews.h"
    default:
        AssertOrFailFast(UNREACHED);
    }
}